

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O1

bool __thiscall
replay_entry_t::match(replay_entry_t *this,ped_type_t type,__cilkrts_pedigree *node,int victim)

{
  short sVar1;
  ulong uVar2;
  
  if (this->m_type != type) {
    return false;
  }
  uVar2 = 0;
  if ((type == ped_type_steal) && (this->m_value != victim)) {
    return false;
  }
  sVar1 = this->m_pedigree_len;
  if (0 < sVar1 && node != (__cilkrts_pedigree *)0x0) {
    uVar2 = 0;
    do {
      if (node->rank != this->m_reverse_pedigree[uVar2]) {
        return false;
      }
      node = node->parent;
      uVar2 = uVar2 + 1;
    } while ((node != (__cilkrts_pedigree *)0x0) && (uVar2 < (ulong)(long)(int)sVar1));
  }
  return (int)uVar2 == (int)sVar1 && node == (__cilkrts_pedigree *)0x0;
}

Assistant:

bool match (ped_type_t type, const __cilkrts_pedigree *node, int victim = -1)
    {
        int i = 0;

        // If the type isn't what they're seeking, we don't have a match
        if (type != m_type)
            return false;

        // If we're looking for a STEAL, then the victim must match
        if ((type == ped_type_steal) && (victim != m_value))
            return false;

        // Compare the current pedigree against what was recorded
        while ((NULL != node) && (i < m_pedigree_len))
        {
            // If we've got a pedigree rank difference, then we don't have
            // a match
            if (node->rank != m_reverse_pedigree[i])
                return false;
            node = node->parent;
            i++;
        }

        // Make sure we exhausted both the pedigree chain and the recorded
        // pedigree
        return ((NULL == node) && (i == m_pedigree_len));
    }